

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::PrintGeneratorList(cmake *this)

{
  undefined1 local_d0 [8];
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  cmDocumentation doc;
  cmake *this_local;
  
  cmDocumentation::cmDocumentation
            ((cmDocumentation *)
             &generators.
              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  GetGeneratorsDocumentation
            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_d0,this);
  cmDocumentation::AppendSection
            ((cmDocumentation *)
             &generators.
              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,"Generators",
             (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_d0);
  std::operator<<((ostream *)&std::cerr,"\n");
  cmDocumentation::PrintDocumentation
            ((cmDocumentation *)
             &generators.
              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ListGenerators,(ostream *)&std::cerr
            );
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_d0);
  cmDocumentation::~cmDocumentation
            ((cmDocumentation *)
             &generators.
              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmake::PrintGeneratorList()
{
#ifndef CMAKE_BOOTSTRAP
  cmDocumentation doc;
  auto generators = this->GetGeneratorsDocumentation();
  doc.AppendSection("Generators", generators);
  std::cerr << "\n";
  doc.PrintDocumentation(cmDocumentation::ListGenerators, std::cerr);
#endif
}